

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::
     log<char_const(&)[46],kj::_::DebugComparison<kj::MappedIterator<kj::InsertionOrderIndex::Iterator,kj::_::TableMapping<unsigned_int>>,kj::MappedIterator<kj::InsertionOrderIndex::Iterator,kj::_::TableMapping<unsigned_int>>>&>
               (char *file,char line [7],LogSeverity severity,char *macroArgs,char (*params) [46],
               DebugComparison<kj::MappedIterator<kj::InsertionOrderIndex::Iterator,_kj::_::TableMapping<unsigned_int>_>,_kj::MappedIterator<kj::InsertionOrderIndex::Iterator,_kj::_::TableMapping<unsigned_int>_>_>
               *params_1)

{
  char (*pacVar1) [46];
  LogSeverity line_00;
  uint uVar2;
  Debug *this;
  undefined4 in_register_00000014;
  ArrayPtr<kj::String> AVar3;
  ArrayPtr<kj::String> in_stack_ffffffffffffff08;
  String *local_c0;
  undefined1 local_68 [8];
  char argValues [2] [7];
  kj local_50 [24];
  DebugComparison<kj::MappedIterator<kj::InsertionOrderIndex::Iterator,_kj::_::TableMapping<unsigned_int>_>,_kj::MappedIterator<kj::InsertionOrderIndex::Iterator,_kj::_::TableMapping<unsigned_int>_>_>
  *local_30;
  DebugComparison<kj::MappedIterator<kj::InsertionOrderIndex::Iterator,_kj::_::TableMapping<unsigned_int>_>,_kj::MappedIterator<kj::InsertionOrderIndex::Iterator,_kj::_::TableMapping<unsigned_int>_>_>
  *params_local_1;
  char (*params_local) [46];
  char *macroArgs_local;
  LogSeverity severity_local;
  char *file_local;
  
  macroArgs_local._4_4_ = line._0_4_;
  local_30 = params_1;
  params_local_1 =
       (DebugComparison<kj::MappedIterator<kj::InsertionOrderIndex::Iterator,_kj::_::TableMapping<unsigned_int>_>,_kj::MappedIterator<kj::InsertionOrderIndex::Iterator,_kj::_::TableMapping<unsigned_int>_>_>
        *)params;
  params_local = (char (*) [46])macroArgs;
  macroArgs_local._0_4_ = severity;
  _severity_local = (Debug *)file;
  str<char_const(&)[46]>
            ((String *)local_68,(kj *)params,(char (*) [46])CONCAT44(in_register_00000014,severity))
  ;
  str<kj::_::DebugComparison<kj::MappedIterator<kj::InsertionOrderIndex::Iterator,kj::_::TableMapping<unsigned_int>>,kj::MappedIterator<kj::InsertionOrderIndex::Iterator,kj::_::TableMapping<unsigned_int>>>&>
            (local_50,local_30);
  this = _severity_local;
  uVar2 = macroArgs_local._4_4_;
  line_00 = (LogSeverity)macroArgs_local;
  pacVar1 = params_local;
  AVar3 = arrayPtr<kj::String>((String *)local_68,2);
  logInternal(this,(char *)(ulong)uVar2,line_00,(LogSeverity)pacVar1,(char *)AVar3.ptr,
              in_stack_ffffffffffffff08);
  local_c0 = (String *)&stack0xffffffffffffffc8;
  do {
    local_c0 = local_c0 + -1;
    String::~String(local_c0);
  } while (local_c0 != (String *)local_68);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}